

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O1

void save_cb(Fl_Widget *param_1,void *v)

{
  int iVar1;
  char *__name;
  char *pcVar2;
  int *piVar3;
  char *pcVar4;
  Fl_Native_File_Chooser fnfc;
  Fl_Native_File_Chooser local_60;
  
  Fl_Native_File_Chooser::Fl_Native_File_Chooser(&local_60,0);
  if ((filename == (char *)0x0 || v != (void *)0x0) || (__name = filename, *filename == '\0')) {
    Fl_Native_File_Chooser::title(&local_60,"Save To:");
    Fl_Native_File_Chooser::type(&local_60,4);
    Fl_Native_File_Chooser::filter(&local_60,"FLUID Files\t*.f[ld]");
    iVar1 = Fl_Native_File_Chooser::show(&local_60);
    if (iVar1 != 0) goto LAB_0019933d;
    __name = Fl_Native_File_Chooser::filename(&local_60);
    iVar1 = access(__name,0);
    if (iVar1 == 0) {
      pcVar2 = strrchr(__name,0x2f);
      pcVar4 = pcVar2 + 1;
      if (pcVar2 == (char *)0x0) {
        pcVar4 = __name;
      }
      iVar1 = fl_choice("The file \"%s\" already exists.\nDo you want to replace it?","Cancel",
                        "Replace",(char *)0x0,pcVar4);
      if (iVar1 == 0) goto LAB_0019933d;
    }
    if ((undefined1 *)v != &DAT_00000002) {
      set_filename(__name);
    }
  }
  iVar1 = write_file(__name,0);
  if (iVar1 == 0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fl_alert("Error writing %s: %s",__name,pcVar4);
  }
  else if ((undefined1 *)v != &DAT_00000002) {
    set_modflag(0);
    undo_save = undo_current;
  }
LAB_0019933d:
  Fl_Native_File_Chooser::~Fl_Native_File_Chooser(&local_60);
  return;
}

Assistant:

void save_cb(Fl_Widget *, void *v) {
  Fl_Native_File_Chooser fnfc;
  const char *c = filename;
  if (v || !c || !*c) {    
    fnfc.title("Save To:");
    fnfc.type(Fl_Native_File_Chooser::BROWSE_SAVE_FILE);
    fnfc.filter("FLUID Files\t*.f[ld]");
    if (fnfc.show() != 0) return;
    c = fnfc.filename();
    if (!access(c, 0)) {
      const char *basename;
      if ((basename = strrchr(c, '/')) != NULL)
        basename ++;
#if defined(WIN32) || defined(__EMX__)
      if ((basename = strrchr(c, '\\')) != NULL)
        basename ++;
#endif // WIN32 || __EMX__
      else
        basename = c;

      if (fl_choice("The file \"%s\" already exists.\n"
                    "Do you want to replace it?", "Cancel",
		    "Replace", NULL, basename) == 0) return;
    }

    if (v != (void *)2) set_filename(c);
  }
  if (!write_file(c)) {
    fl_alert("Error writing %s: %s", c, strerror(errno));
    return;
  }

  if (v != (void *)2) {
    set_modflag(0);
    undo_save = undo_current;
  }
}